

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::format_uint<3u,char,unsigned_int>
                 (char *buffer,uint value,int num_digits,bool upper)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar2 = (byte *)(buffer + num_digits);
  uVar3 = (ulong)value;
  do {
    pbVar2 = pbVar2 + -1;
    *pbVar2 = (byte)value & 7 | 0x30;
    uVar3 = uVar3 >> 3;
    bVar1 = 7 < value;
    value = (uint)uVar3;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

inline Char *format_uint(Char *buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char *end = buffer;
  do {
    const char *digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}